

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  bool bVar1;
  int iVar2;
  size_t max;
  char *pcVar3;
  long lVar4;
  byte *pbVar5;
  ushort **ppuVar6;
  ulong uVar7;
  char *pcVar8;
  byte bVar9;
  byte *pbVar10;
  uint uVar11;
  byte *__s;
  char *pcVar12;
  curl_slist *pcVar13;
  CURLcode CVar14;
  bool bVar15;
  bool bVar16;
  char *local_40;
  curl_slist *local_38;
  
  if (conn_to_host == (curl_slist *)0x0) {
    return CURLE_OK;
  }
LAB_005117c9:
  pcVar12 = conn_to_host->data;
  local_38 = conn_to_host;
  if (*pcVar12 == ':') {
    pcVar12 = pcVar12 + 1;
    bVar15 = true;
LAB_0051187b:
    if (bVar15) {
      if (*pcVar12 != ':') {
        pcVar3 = strchr(pcVar12,0x3a);
        if (pcVar3 != (char *)0x0) {
          local_40 = (char *)0x0;
          lVar4 = strtol(pcVar12,&local_40,10);
          if (local_40 == pcVar3) {
            bVar16 = lVar4 == conn->remote_port;
            if (bVar16) {
              pcVar12 = pcVar3 + 1;
            }
            goto LAB_005118cd;
          }
        }
        goto LAB_005118cb;
      }
      bVar16 = true;
      pcVar12 = pcVar12 + 1;
    }
    else {
LAB_005118cb:
      bVar16 = false;
    }
LAB_005118cd:
    pcVar13 = local_38;
    bVar1 = true;
    uVar11 = 0xffffffff;
    if (!bVar15) {
      CVar14 = CURLE_OK;
      bVar1 = true;
      goto LAB_0051197e;
    }
    if ((!bVar16) || (*pcVar12 == '\0')) {
      pcVar12 = (char *)0x0;
      CVar14 = CURLE_OK;
      goto LAB_00511b17;
    }
    pbVar5 = (byte *)(*Curl_cstrdup)(pcVar12);
    if (pbVar5 == (byte *)0x0) {
      CVar14 = CURLE_OUT_OF_MEMORY;
      pcVar12 = (char *)0x0;
      bVar1 = false;
      goto LAB_00511b17;
    }
    pbVar10 = pbVar5;
    __s = pbVar5;
    if (*pbVar5 == 0x5b) {
      pbVar10 = pbVar5 + 1;
      bVar9 = pbVar5[1];
      __s = pbVar10;
      if (bVar9 != 0) {
        ppuVar6 = __ctype_b_loc();
        __s = pbVar5 + 2;
        do {
          if (((((*ppuVar6)[bVar9] >> 0xc & 1) == 0) && (bVar9 != 0x2e)) && (bVar9 != 0x3a)) {
            if (bVar9 == 0x25) {
              iVar2 = strncmp("%25",(char *)(__s + -1),3);
              if (iVar2 != 0) {
                Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
              }
              bVar9 = *__s;
              if (bVar9 == 0) goto LAB_00511a2e;
              goto LAB_005119fc;
            }
            break;
          }
          bVar9 = *__s;
          __s = __s + 1;
        } while (bVar9 != 0);
        __s = __s + -1;
      }
      goto LAB_00511a2e;
    }
    goto LAB_00511a52;
  }
  bVar15 = (conn->bits).ipv6_ip != false;
  pcVar3 = "";
  if (bVar15) {
    pcVar3 = "[";
  }
  pcVar8 = "";
  if (bVar15) {
    pcVar8 = "]";
  }
  bVar15 = false;
  pcVar3 = curl_maprintf("%s%s%s",pcVar3,(conn->host).name,pcVar8);
  if (pcVar3 != (char *)0x0) {
    max = strlen(pcVar3);
    iVar2 = Curl_strncasecompare(pcVar12,pcVar3,max);
    (*Curl_cfree)(pcVar3);
    bVar15 = false;
    if (iVar2 != 0) {
      bVar15 = pcVar12[max] == ':';
    }
    pcVar12 = pcVar12 + max + 1;
  }
  if (pcVar3 != (char *)0x0) goto LAB_0051187b;
  CVar14 = CURLE_OUT_OF_MEMORY;
  bVar1 = false;
LAB_0051197e:
  pcVar12 = (char *)0x0;
  uVar11 = 0xffffffff;
  pcVar13 = local_38;
  goto LAB_00511b17;
  while( true ) {
    bVar9 = __s[1];
    __s = __s + 1;
    if (bVar9 == 0) break;
LAB_005119fc:
    if (((((*ppuVar6)[bVar9] & 0x1400) == 0) && (1 < bVar9 - 0x2d)) &&
       ((bVar9 != 0x5f && (bVar9 != 0x7e)))) break;
  }
LAB_00511a2e:
  if (*__s == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
    Curl_infof(data,"Invalid IPv6 address format\n");
  }
LAB_00511a52:
  pcVar12 = strchr((char *)__s,0x3a);
  if (pcVar12 == (char *)0x0) {
    uVar11 = 0xffffffff;
  }
  else {
    local_40 = (char *)0x0;
    *pcVar12 = '\0';
    uVar11 = 0xffffffff;
    if (pcVar12[1] != '\0') {
      uVar7 = strtol(pcVar12 + 1,&local_40,10);
      if (((local_40 == (char *)0x0) || (*local_40 == '\0')) && (uVar7 < 0x10000)) {
        uVar11 = (uint)uVar7;
      }
      else {
        Curl_infof(data,"No valid port number in connect to host string (%s)\n",pcVar12 + 1);
        pbVar10 = (byte *)0x0;
      }
    }
  }
  bVar1 = true;
  if (pbVar10 == (byte *)0x0) {
    pcVar12 = (char *)0x0;
    CVar14 = CURLE_OK;
  }
  else {
    pcVar12 = (*Curl_cstrdup)((char *)pbVar10);
    CVar14 = CURLE_OK;
    if (pcVar12 == (char *)0x0) {
      CVar14 = CURLE_OUT_OF_MEMORY;
      uVar11 = 0xffffffff;
      bVar1 = false;
    }
  }
  (*Curl_cfree)(pbVar5);
LAB_00511b17:
  if (!bVar1) {
    return CVar14;
  }
  if ((pcVar12 == (char *)0x0) || (*pcVar12 == '\0')) {
    (conn->bits).conn_to_host = false;
    (*Curl_cfree)(pcVar12);
    bVar15 = true;
  }
  else {
    (conn->conn_to_host).rawalloc = pcVar12;
    (conn->conn_to_host).name = pcVar12;
    (conn->bits).conn_to_host = true;
    bVar15 = false;
    Curl_infof(data,"Connecting to hostname: %s\n",pcVar12);
  }
  if ((int)uVar11 < 0) {
    (conn->bits).conn_to_port = false;
  }
  else {
    conn->conn_to_port = uVar11;
    (conn->bits).conn_to_port = true;
    Curl_infof(data,"Connecting to port: %d\n",(ulong)uVar11);
  }
  conn_to_host = pcVar13->next;
  if (!bVar15 || conn_to_host == (curl_slist *)0x0) {
    return CURLE_OK;
  }
  if (-1 < (int)uVar11) {
    return CURLE_OK;
  }
  goto LAB_005117c9;
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = -1;

  while(conn_to_host && !host && port == -1) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      infof(data, "Connecting to hostname: %s\n", host);
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      Curl_safefree(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d\n", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
      port = -1;
    }

    conn_to_host = conn_to_host->next;
  }

  return result;
}